

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O2

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined4 *puVar7;
  int _w;
  ulong uVar8;
  long lVar9;
  undefined4 *puVar10;
  ulong uVar11;
  long lVar12;
  int local_d0;
  long local_c0;
  Mat m;
  Mat local_68;
  
  iVar1 = bottom_blob->c;
  iVar4 = this->stride;
  _w = bottom_blob->w / iVar4;
  uVar11 = (long)bottom_blob->h / (long)iVar4;
  iVar2 = (int)uVar11;
  Mat::create(top_blob,_w,iVar2,iVar4 * iVar1 * iVar4,bottom_blob->elemsize,opt->blob_allocator);
  local_d0 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (_w < 1) {
      _w = 0;
    }
    uVar11 = uVar11 & 0xffffffff;
    if (iVar2 < 1) {
      uVar11 = 0;
    }
    local_d0 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (iVar4 = 0; iVar4 != iVar1; iVar4 = iVar4 + 1) {
      Mat::channel(&m,bottom_blob,iVar4);
      uVar3 = (ulong)(uint)this->stride;
      local_c0 = 0;
      for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
        lVar12 = 0;
        lVar9 = 0;
        while( true ) {
          iVar2 = (int)uVar3;
          if (iVar2 <= lVar9) break;
          Mat::channel(&local_68,top_blob,(int)lVar9 + (iVar2 * iVar4 + (int)lVar6) * iVar2);
          puVar7 = (undefined4 *)local_68.data;
          Mat::~Mat(&local_68);
          uVar3 = (ulong)this->stride;
          puVar5 = (undefined4 *)(local_c0 * m.w + lVar12 + (long)m.data);
          for (uVar8 = 0; puVar10 = puVar5, iVar2 = _w, uVar8 != uVar11; uVar8 = uVar8 + 1) {
            while (iVar2 != 0) {
              *puVar7 = *puVar10;
              puVar7 = puVar7 + 1;
              puVar10 = puVar10 + uVar3;
              iVar2 = iVar2 + -1;
            }
            puVar5 = (undefined4 *)((long)puVar5 + (long)m.w * uVar3 * 4);
          }
          lVar9 = lVar9 + 1;
          lVar12 = lVar12 + 4;
        }
        local_c0 = local_c0 + 4;
      }
      Mat::~Mat(&m);
    }
  }
  return local_d0;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                float* outptr = top_blob.channel(q*stride*stride + sh*stride + sw);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i*stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}